

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O3

void __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::
PushModelTo<TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>>
          (FlatModel<mp::DefaultFlatModelParams> *this,
          TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
          *mapi)

{
  CreateFlatModelInfo(this,&mapi->super_BasicFlatModelAPI);
  (mapi->super_BasicFlatModelAPI).pfmi_ =
       (this->pfmi_)._M_t.
       super___uniq_ptr_impl<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_>._M_t.
       super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
       super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl;
  PushVariablesTo<TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>>
            (this,mapi);
  ConstraintManager::AddUnbridgedConstraintsToBackend
            (&this->super_ConstraintManager,&mapi->super_BasicFlatModelAPI,&this->var_namer_);
  ConstraintManager::LogConstraintGroups
            (&this->super_ConstraintManager,&mapi->super_BasicFlatModelAPI);
  if (this->if_skip_push_objs_bjs_ != false) {
    return;
  }
  PushObjectivesTo<TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>>
            (this,mapi);
  return;
}

Assistant:

void PushModelTo(ModelAPI& mapi) const {
    CreateFlatModelInfo(mapi);
    mapi.PassFlatModelInfo(GetModelInfo());

    mapi.InitProblemModificationPhase(GetModelInfo());
    PushVariablesTo(mapi);
    PushCustomConstraintsTo(mapi);
    if (!if_skip_pushing_objs())
      PushObjectivesTo(mapi);
    mapi.FinishProblemModificationPhase();
  }